

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmCTestVC.cxx
# Opt level: O1

bool __thiscall cmCTestVC::UpdateImpl(cmCTestVC *this)

{
  cmCTest *this_00;
  ostringstream cmCTestLog_msg;
  long *local_1a8;
  long local_198 [2];
  long local_188 [14];
  ios_base local_118 [264];
  
  std::__cxx11::ostringstream::ostringstream((ostringstream *)local_188);
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)local_188,"* Unknown VCS tool, not updating!",0x21);
  std::ios::widen((char)(ostringstream *)local_188 + (char)*(undefined8 *)(local_188[0] + -0x18));
  std::ostream::put((char)local_188);
  std::ostream::flush();
  this_00 = this->CTest;
  std::__cxx11::stringbuf::str();
  cmCTest::Log(this_00,5,
               "/workspace/llm4binary/github/license_all_cmakelists_25/JKorbelRA[P]CMake/Source/CTest/cmCTestVC.cxx"
               ,0xbc,(char *)local_1a8,false);
  if (local_1a8 != local_198) {
    operator_delete(local_1a8,local_198[0] + 1);
  }
  std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_188);
  std::ios_base::~ios_base(local_118);
  return true;
}

Assistant:

bool cmCTestVC::UpdateImpl()
{
  cmCTestLog(this->CTest, HANDLER_VERBOSE_OUTPUT,
             "* Unknown VCS tool, not updating!" << std::endl);
  return true;
}